

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  unkbyte10 Var31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar87;
  short sVar88;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  long lVar89;
  ushort uVar90;
  ushort uVar91;
  short sVar92;
  ushort uVar100;
  short sVar101;
  ushort uVar103;
  short sVar104;
  ushort uVar106;
  short sVar107;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ushort uVar99;
  ushort uVar102;
  ushort uVar108;
  ushort uVar109;
  short sVar110;
  ushort uVar115;
  ushort uVar118;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar105;
  undefined1 auVar98 [16];
  ushort uVar116;
  short sVar117;
  ushort uVar119;
  short sVar120;
  ushort uVar121;
  short sVar122;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int local_1488;
  int local_1484;
  int local_1470;
  int local_146c;
  int local_1458;
  int local_1454;
  int local_1440;
  int local_143c;
  int local_1428;
  int local_1424;
  int local_1410;
  int local_140c;
  int local_13f8;
  int local_13f4;
  int local_13e0;
  int local_13dc;
  int local_13a0;
  int local_139c;
  longlong *plStack_1398;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *l;
  int16_t *s;
  int16_t *m;
  int16_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case0;
  __m128i case2;
  __m128i case1;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_f50;
  short local_f4e;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *FL_pr;
  int16_t *FS_pr;
  int16_t *FM_pr;
  int16_t *F_pr;
  int16_t *HL_pr;
  int16_t *HS_pr;
  int16_t *HM_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_FL_pr;
  int16_t *_FS_pr;
  int16_t *_FM_pr;
  int16_t *_F_pr;
  int16_t *_HL_pr;
  int16_t *_HS_pr;
  int16_t *_HM_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  ushort local_a88;
  ushort uStack_a86;
  ushort uStack_a84;
  ushort uStack_a82;
  ushort uStack_a80;
  ushort uStack_a7e;
  ushort uStack_a7c;
  ushort uStack_a7a;
  short local_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short local_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  short sStack_a60;
  short sStack_a5e;
  short sStack_a5c;
  short sStack_a5a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  short local_a48;
  short sStack_a46;
  short sStack_a44;
  short sStack_a42;
  short sStack_a40;
  short sStack_a3e;
  short sStack_a3c;
  short sStack_a3a;
  short local_a38;
  short sStack_a36;
  short sStack_a34;
  short sStack_a32;
  short sStack_a30;
  short sStack_a2e;
  short sStack_a2c;
  short sStack_a2a;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint uStack_134;
  uint uStack_12c;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_diag_sse41_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_diag_sse41_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_diag_sse41_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_diag_sse41_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_diag_sse41_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sw_stats_diag_sse41_128_16");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_diag_sse41_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_diag_sse41_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_13a0 = _s1Len;
    if (matrix->type != 0) {
      local_13a0 = matrix->length;
    }
    _POS_LIMIT = 0;
    _matches = 0;
    N._0_2_ = (short)open;
    sVar87 = (short)N;
    if (matrix->min <= -open) {
      sVar87 = -(short)matrix->min;
    }
    sVar87 = sVar87 + -0x7fff;
    sVar88 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar87,CONCAT24(sVar87,CONCAT22(sVar87,sVar87)));
    vSaturationCheckMax[0] = CONCAT26(sVar87,CONCAT24(sVar87,CONCAT22(sVar87,sVar87)));
    vSaturationCheckMax[1] = CONCAT26(sVar88,CONCAT24(sVar88,CONCAT22(sVar88,sVar88)));
    vSaturationCheckMin[0] = CONCAT26(sVar88,CONCAT24(sVar88,CONCAT22(sVar88,sVar88)));
    uVar25 = CONCAT26(sVar87,CONCAT24(sVar87,CONCAT22(sVar87,sVar87)));
    uVar114 = CONCAT26(sVar87,CONCAT24(sVar87,CONCAT22(sVar87,sVar87)));
    auVar32._8_8_ = uVar114;
    auVar32._0_8_ = uVar25;
    uVar26 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar28 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (undefined2)gap;
    uVar27 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    uVar29 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    vMaxH[0] = uVar114;
    vMaxM[1] = uVar25;
    vMaxM[0] = uVar114;
    vMaxS[1] = uVar25;
    vMaxS[0] = uVar114;
    vMaxL[1] = uVar25;
    vMaxL[0] = uVar114;
    vEndI[1] = uVar25;
    vEndI[0] = uVar114;
    vEndJ[1] = uVar25;
    vEndJ[0] = uVar114;
    vILimit[1] = uVar25;
    s2Len_PAD._0_2_ = (short)local_13a0;
    vILimit[0] = CONCAT26((short)s2Len_PAD,
                          CONCAT24((short)s2Len_PAD,CONCAT22((short)s2Len_PAD,(short)s2Len_PAD)));
    gap_local._0_2_ = (short)s2Len;
    _s1_local = (char *)parasail_result_new_stats();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8211004;
      ptr = parasail_memalign_int16_t(0x10,(long)(local_13a0 + 7));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_02 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_03 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_04 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_05 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_06 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_07 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_08 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        for (end_query = 0; end_query < local_13a0; end_query = end_query + 1) {
          ptr[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
        }
        for (end_query = local_13a0; end_query < local_13a0 + 7; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar9 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = 0;
        }
        while (end_ref = iVar9, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = 0;
          iVar9 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 7] = 0;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = sVar87;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
        }
        for (end_ref = -7; iVar9 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 7] = sVar87;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = sVar87;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
        }
        while (end_ref = iVar9, end_ref < s2Len + 7) {
          ptr_01[(long)end_ref + 7] = sVar87;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = sVar87;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
          iVar9 = end_ref + 1;
        }
        ptr_01[6] = 0;
        for (end_query = 0; end_query < local_13a0; end_query = end_query + 8) {
          vOpen[1] = auVar32._2_8_;
          vNegInf0[0] = uVar114 >> 0x10;
          vNH[0] = vNegInf0[0];
          vNM[1] = vOpen[1];
          stack0xffffffffffffeef8 = ZEXT816(0);
          stack0xffffffffffffeee8 = ZEXT816(0);
          stack0xffffffffffffeed8 = ZEXT816(0);
          vWH[0]._6_2_ = 0;
          stack0xffffffffffffeeb8 = ZEXT816(0);
          stack0xffffffffffffeea8 = ZEXT816(0);
          stack0xffffffffffffee98 = ZEXT816(0);
          vE[0] = uVar114;
          vE_opn[1] = uVar25;
          stack0xffffffffffffee58 = ZEXT816(0);
          stack0xffffffffffffee48 = ZEXT816(0);
          stack0xffffffffffffee38 = ZEXT816(0);
          vF[0] = uVar114;
          vF_opn[1] = uVar25;
          stack0xffffffffffffedf8 = ZEXT816(0);
          stack0xffffffffffffede8 = ZEXT816(0);
          stack0xffffffffffffedd8 = ZEXT816(0);
          vJ[0]._0_6_ = 0xfffffffefffd;
          vs1[1] = 0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          lVar89 = (long)end_query;
          sVar1 = ptr[lVar89];
          sVar2 = ptr[lVar89 + 1];
          sVar3 = ptr[lVar89 + 2];
          sVar4 = ptr[lVar89 + 3];
          sVar5 = ptr[lVar89 + 4];
          sVar6 = ptr[lVar89 + 5];
          sVar7 = ptr[lVar89 + 6];
          sVar8 = ptr[lVar89 + 7];
          vs2[0] = uVar114;
          matrow0 = (int *)uVar25;
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_13dc = (int)ptr[end_query];
          }
          else {
            if (end_query < local_13a0) {
              local_13e0 = end_query;
            }
            else {
              local_13e0 = local_13a0 + -1;
            }
            local_13dc = local_13e0;
          }
          piVar18 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_13f4 = (int)ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_13a0) {
              local_13f8 = end_query + 1;
            }
            else {
              local_13f8 = local_13a0 + -1;
            }
            local_13f4 = local_13f8;
          }
          piVar19 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_140c = (int)ptr[end_query + 2];
          }
          else {
            if (end_query + 2 < local_13a0) {
              local_1410 = end_query + 2;
            }
            else {
              local_1410 = local_13a0 + -1;
            }
            local_140c = local_1410;
          }
          piVar20 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_1424 = (int)ptr[end_query + 3];
          }
          else {
            if (end_query + 3 < local_13a0) {
              local_1428 = end_query + 3;
            }
            else {
              local_1428 = local_13a0 + -1;
            }
            local_1424 = local_1428;
          }
          piVar21 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_143c = (int)ptr[end_query + 4];
          }
          else {
            if (end_query + 4 < local_13a0) {
              local_1440 = end_query + 4;
            }
            else {
              local_1440 = local_13a0 + -1;
            }
            local_143c = local_1440;
          }
          piVar22 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_1454 = (int)ptr[end_query + 5];
          }
          else {
            if (end_query + 5 < local_13a0) {
              local_1458 = end_query + 5;
            }
            else {
              local_1458 = local_13a0 + -1;
            }
            local_1454 = local_1458;
          }
          piVar23 = matrix->matrix;
          iVar15 = matrix->size;
          if (matrix->type == 0) {
            local_146c = (int)ptr[end_query + 6];
          }
          else {
            if (end_query + 6 < local_13a0) {
              local_1470 = end_query + 6;
            }
            else {
              local_1470 = local_13a0 + -1;
            }
            local_146c = local_1470;
          }
          piVar24 = matrix->matrix;
          iVar16 = matrix->size;
          if (matrix->type == 0) {
            local_1484 = (int)ptr[end_query + 7];
          }
          else {
            if (end_query + 7 < local_13a0) {
              local_1488 = end_query + 7;
            }
            else {
              local_1488 = local_13a0 + -1;
            }
            local_1484 = local_1488;
          }
          sStack_a20 = (short)vILimit[0];
          sStack_a1e = (short)((ulong)vILimit[0] >> 0x10);
          sStack_a1c = (short)((ulong)vILimit[0] >> 0x20);
          sStack_a1a = (short)((ulong)vILimit[0] >> 0x30);
          local_a38 = (short)vJreset[1];
          sStack_a36 = vJreset[1]._2_2_;
          sStack_a34 = vJreset[1]._4_2_;
          sStack_a32 = vJreset[1]._6_2_;
          sStack_a30 = (short)vJreset[2];
          sStack_a2e = vJreset[2]._2_2_;
          sStack_a2c = vJreset[2]._4_2_;
          sStack_a2a = vJreset[2]._6_2_;
          vWM[1]._0_2_ = sVar87;
          vWM[1]._2_2_ = sVar87;
          vWM[1]._4_2_ = sVar87;
          vWM[1]._6_2_ = sVar87;
          vWH[0]._0_2_ = sVar87;
          vWH[0]._2_2_ = sVar87;
          vWH[0]._4_2_ = sVar87;
          for (end_ref = 0; auVar56 = stack0xffffffffffffef08, auVar55 = stack0xffffffffffffeef8,
              auVar54 = stack0xffffffffffffeee8, auVar53 = stack0xffffffffffffeed8,
              auVar97 = stack0xffffffffffffee28, auVar124 = stack0xffffffffffffedf8,
              auVar98 = stack0xffffffffffffede8, auVar123 = stack0xffffffffffffedd8,
              auVar125 = _matrow0, end_ref < s2Len + 7; end_ref = end_ref + 1) {
            Var31 = CONCAT28((short)vWH[0],
                             CONCAT26(vWM[1]._6_2_,
                                      CONCAT24(vWM[1]._4_2_,CONCAT22(vWM[1]._2_2_,(short)vWM[1]))));
            auVar30._10_2_ = vWH[0]._2_2_;
            auVar30._0_10_ = Var31;
            auVar30._12_2_ = vWH[0]._4_2_;
            auVar30._14_2_ = vWH[0]._6_2_;
            stack0xffffffffffffef08 = auVar30._2_14_;
            vNH[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar86 = stack0xffffffffffffef08;
            stack0xffffffffffffeef8 = vWS._10_14_;
            vNM[0]._6_2_ = ptr_02[(long)end_ref + 7];
            auVar85 = stack0xffffffffffffeef8;
            stack0xffffffffffffeee8 = vWL._10_14_;
            vNS[0]._6_2_ = ptr_03[(long)end_ref + 7];
            auVar84 = stack0xffffffffffffeee8;
            stack0xffffffffffffeed8 = vE._10_14_;
            vNL[0]._6_2_ = ptr_04[(long)end_ref + 7];
            auVar76 = stack0xffffffffffffeed8;
            stack0xffffffffffffee28 = vF_opn._10_14_;
            vF[0]._6_2_ = ptr_05[(long)end_ref + 7];
            auVar33 = stack0xffffffffffffee28;
            stack0xffffffffffffedf8 = vFS._10_14_;
            vFM[0]._6_2_ = ptr_06[(long)end_ref + 7];
            auVar58 = stack0xffffffffffffedf8;
            stack0xffffffffffffede8 = vFL._10_14_;
            vFS[0]._6_2_ = ptr_07[(long)end_ref + 7];
            auVar57 = stack0xffffffffffffede8;
            stack0xffffffffffffedd8 = vJ._10_14_;
            vFL[0]._6_2_ = ptr_08[(long)end_ref + 7];
            auVar30 = stack0xffffffffffffedd8;
            vNM[1] = (longlong)((unkuint10)Var31 >> 0x10);
            vNH[0] = auVar86._8_8_;
            auVar34._8_8_ = vNH[0];
            auVar34._0_8_ = vNM[1];
            auVar96._8_8_ = uVar28;
            auVar96._0_8_ = uVar26;
            auVar96 = psubsw(auVar34,auVar96);
            vF_opn[1] = auVar97._2_8_;
            vF[0] = auVar33._8_8_;
            auVar33._8_8_ = vF[0];
            auVar33._0_8_ = vF_opn[1];
            auVar97._8_8_ = uVar29;
            auVar97._0_8_ = uVar27;
            auVar97 = psubsw(auVar33,auVar97);
            local_a48 = auVar96._0_2_;
            sStack_a46 = auVar96._2_2_;
            sStack_a44 = auVar96._4_2_;
            sStack_a42 = auVar96._6_2_;
            sStack_a40 = auVar96._8_2_;
            sStack_a3e = auVar96._10_2_;
            sStack_a3c = auVar96._12_2_;
            sStack_a3a = auVar96._14_2_;
            local_a58 = auVar97._0_2_;
            sStack_a56 = auVar97._2_2_;
            sStack_a54 = auVar97._4_2_;
            sStack_a52 = auVar97._6_2_;
            sStack_a50 = auVar97._8_2_;
            sStack_a4e = auVar97._10_2_;
            sStack_a4c = auVar97._12_2_;
            sStack_a4a = auVar97._14_2_;
            uVar90 = (ushort)(local_a48 < local_a58) * local_a58 |
                     (ushort)(local_a48 >= local_a58) * local_a48;
            uVar99 = (ushort)(sStack_a46 < sStack_a56) * sStack_a56 |
                     (ushort)(sStack_a46 >= sStack_a56) * sStack_a46;
            uVar102 = (ushort)(sStack_a44 < sStack_a54) * sStack_a54 |
                      (ushort)(sStack_a44 >= sStack_a54) * sStack_a44;
            uVar105 = (ushort)(sStack_a42 < sStack_a52) * sStack_a52 |
                      (ushort)(sStack_a42 >= sStack_a52) * sStack_a42;
            vF[0]._0_2_ = (ushort)(sStack_a40 < sStack_a50) * sStack_a50 |
                          (ushort)(sStack_a40 >= sStack_a50) * sStack_a40;
            vF[0]._2_2_ = (ushort)(sStack_a3e < sStack_a4e) * sStack_a4e |
                          (ushort)(sStack_a3e >= sStack_a4e) * sStack_a3e;
            vF[0]._4_2_ = (ushort)(sStack_a3c < sStack_a4c) * sStack_a4c |
                          (ushort)(sStack_a3c >= sStack_a4c) * sStack_a3c;
            vF[0]._6_2_ = (ushort)(sStack_a3a < sStack_a4a) * sStack_a4a |
                          (ushort)(sStack_a3a >= sStack_a4a) * sStack_a3a;
            vF_opn[1] = CONCAT26(uVar105,CONCAT24(uVar102,CONCAT22(uVar99,uVar90)));
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_a56 < sStack_a46),-(ushort)(local_a58 < local_a48));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_a54 < sStack_a44),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_a52 < sStack_a42),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_a4e < sStack_a3e),-(ushort)(sStack_a50 < sStack_a40));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_a4c < sStack_a3c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_a4a < sStack_a3a),(undefined6)case1[0]);
            vFS[1] = auVar124._2_8_;
            vFM[0] = auVar58._8_8_;
            vNS[1] = vWS._10_8_;
            vNM[0] = auVar85._8_8_;
            auVar75._8_8_ = vFM[0];
            auVar75._0_8_ = vFS[1];
            auVar74._8_8_ = vNM[0];
            auVar74._0_8_ = vNS[1];
            auVar73._8_8_ = case1[0];
            auVar73._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar75,auVar74,auVar73);
            vFL[1] = auVar98._2_8_;
            vFS[0] = auVar57._8_8_;
            vNL[1] = vWL._10_8_;
            vNS[0] = auVar84._8_8_;
            auVar72._8_8_ = vFS[0];
            auVar72._0_8_ = vFL[1];
            auVar71._8_8_ = vNS[0];
            auVar71._0_8_ = vNL[1];
            auVar70._8_8_ = case1[0];
            auVar70._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar72,auVar71,auVar70);
            vJ[1] = auVar123._2_8_;
            vFL[0] = auVar30._8_8_;
            vWH[1] = vE._10_8_;
            vNL[0] = auVar76._8_8_;
            auVar69._8_8_ = vFL[0];
            auVar69._0_8_ = vJ[1];
            auVar68._8_8_ = vNL[0];
            auVar68._0_8_ = vWH[1];
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            auVar123 = pblendvb(auVar69,auVar68,auVar67);
            auVar83._8_8_ = 0x1000100010001;
            auVar83._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(auVar123,auVar83);
            auVar124._2_2_ = vWM[1]._2_2_;
            auVar124._0_2_ = (short)vWM[1];
            auVar124._4_2_ = vWM[1]._4_2_;
            auVar124._6_2_ = vWM[1]._6_2_;
            auVar124._10_2_ = vWH[0]._2_2_;
            auVar124._8_2_ = (short)vWH[0];
            auVar124._12_2_ = vWH[0]._4_2_;
            auVar124._14_2_ = vWH[0]._6_2_;
            auVar98._8_8_ = uVar28;
            auVar98._0_8_ = uVar26;
            auVar98 = psubsw(auVar124,auVar98);
            auVar123._8_8_ = uVar29;
            auVar123._0_8_ = uVar27;
            auVar123 = psubsw(stack0xffffffffffffee88,auVar123);
            local_a68 = auVar98._0_2_;
            sStack_a66 = auVar98._2_2_;
            sStack_a64 = auVar98._4_2_;
            sStack_a62 = auVar98._6_2_;
            sStack_a60 = auVar98._8_2_;
            sStack_a5e = auVar98._10_2_;
            sStack_a5c = auVar98._12_2_;
            sStack_a5a = auVar98._14_2_;
            local_a78 = auVar123._0_2_;
            sStack_a76 = auVar123._2_2_;
            sStack_a74 = auVar123._4_2_;
            sStack_a72 = auVar123._6_2_;
            sStack_a70 = auVar123._8_2_;
            sStack_a6e = auVar123._10_2_;
            sStack_a6c = auVar123._12_2_;
            sStack_a6a = auVar123._14_2_;
            uVar91 = (ushort)(local_a68 < local_a78) * local_a78 |
                     (ushort)(local_a68 >= local_a78) * local_a68;
            uVar100 = (ushort)(sStack_a66 < sStack_a76) * sStack_a76 |
                      (ushort)(sStack_a66 >= sStack_a76) * sStack_a66;
            uVar103 = (ushort)(sStack_a64 < sStack_a74) * sStack_a74 |
                      (ushort)(sStack_a64 >= sStack_a74) * sStack_a64;
            uVar106 = (ushort)(sStack_a62 < sStack_a72) * sStack_a72 |
                      (ushort)(sStack_a62 >= sStack_a72) * sStack_a62;
            uVar108 = (ushort)(sStack_a60 < sStack_a70) * sStack_a70 |
                      (ushort)(sStack_a60 >= sStack_a70) * sStack_a60;
            uVar115 = (ushort)(sStack_a5e < sStack_a6e) * sStack_a6e |
                      (ushort)(sStack_a5e >= sStack_a6e) * sStack_a5e;
            uVar118 = (ushort)(sStack_a5c < sStack_a6c) * sStack_a6c |
                      (ushort)(sStack_a5c >= sStack_a6c) * sStack_a5c;
            uVar121 = (ushort)(sStack_a5a < sStack_a6a) * sStack_a6a |
                      (ushort)(sStack_a5a >= sStack_a6a) * sStack_a5a;
            vE_opn[1] = CONCAT26(uVar106,CONCAT24(uVar103,CONCAT22(uVar100,uVar91)));
            vE[0]._0_2_ = uVar108;
            vE[0]._2_2_ = uVar115;
            vE[0]._4_2_ = uVar118;
            vE[0]._6_2_ = uVar121;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_a76 < sStack_a66),-(ushort)(local_a78 < local_a68));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_a74 < sStack_a64),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_a72 < sStack_a62),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_a6e < sStack_a5e),-(ushort)(sStack_a70 < sStack_a60));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_a6c < sStack_a5c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_a6a < sStack_a5a),(undefined6)case1[0]);
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            auVar124 = pblendvb(stack0xffffffffffffee58,stack0xffffffffffffeeb8,auVar66);
            auVar65._8_8_ = case1[0];
            auVar65._0_8_ = case2[1];
            auVar97 = pblendvb(stack0xffffffffffffee48,stack0xffffffffffffeea8,auVar65);
            auVar64._8_8_ = case1[0];
            auVar64._0_8_ = case2[1];
            auVar123 = pblendvb(stack0xffffffffffffee38,stack0xffffffffffffee98,auVar64);
            auVar82._8_8_ = 0x1000100010001;
            auVar82._0_8_ = 0x1000100010001;
            auVar123 = paddsw(auVar123,auVar82);
            _matrow0 = matrow0._2_14_;
            vs2[0]._6_2_ = ptr_00[(long)end_ref + 7];
            sVar92 = (short)piVar17[(long)(iVar9 * local_13dc) + (long)ptr_00[(long)end_ref + 7]];
            sVar101 = (short)piVar18[(long)(iVar10 * local_13f4) +
                                     (long)ptr_00[(long)(end_ref + -1) + 7]];
            sVar104 = (short)piVar19[(long)(iVar11 * local_140c) +
                                     (long)ptr_00[(long)(end_ref + -2) + 7]];
            sVar107 = (short)piVar20[(long)(iVar12 * local_1424) +
                                     (long)ptr_00[(long)(end_ref + -3) + 7]];
            sVar110 = (short)piVar21[(long)(iVar13 * local_143c) +
                                     (long)ptr_00[(long)(end_ref + -4) + 7]];
            sVar117 = (short)piVar22[(long)(iVar14 * local_1454) +
                                     (long)ptr_00[(long)(end_ref + -5) + 7]];
            sVar120 = (short)piVar23[(long)(iVar15 * local_146c) +
                                     (long)ptr_00[(long)(end_ref + -6) + 7]];
            sVar122 = (short)piVar24[(long)(iVar16 * local_1484) +
                                     (long)ptr_00[(long)(end_ref + -7) + 7]];
            auVar81._2_2_ = sVar120;
            auVar81._0_2_ = sVar122;
            auVar81._4_2_ = sVar117;
            auVar81._6_2_ = sVar110;
            auVar81._10_2_ = sVar104;
            auVar81._8_2_ = sVar107;
            auVar81._12_2_ = sVar101;
            auVar81._14_2_ = sVar92;
            auVar98 = paddsw(auVar56,auVar81);
            local_a88 = auVar98._0_2_;
            uStack_a86 = auVar98._2_2_;
            uStack_a84 = auVar98._4_2_;
            uStack_a82 = auVar98._6_2_;
            uStack_a80 = auVar98._8_2_;
            uStack_a7e = auVar98._10_2_;
            uStack_a7c = auVar98._12_2_;
            uStack_a7a = auVar98._14_2_;
            uVar91 = ((short)local_a88 < (short)uVar91) * uVar91 |
                     ((short)local_a88 >= (short)uVar91) * local_a88;
            uVar100 = ((short)uStack_a86 < (short)uVar100) * uVar100 |
                      ((short)uStack_a86 >= (short)uVar100) * uStack_a86;
            uVar103 = ((short)uStack_a84 < (short)uVar103) * uVar103 |
                      ((short)uStack_a84 >= (short)uVar103) * uStack_a84;
            uVar106 = ((short)uStack_a82 < (short)uVar106) * uVar106 |
                      ((short)uStack_a82 >= (short)uVar106) * uStack_a82;
            uVar109 = ((short)uStack_a80 < (short)uVar108) * uVar108 |
                      ((short)uStack_a80 >= (short)uVar108) * uStack_a80;
            uVar116 = ((short)uStack_a7e < (short)uVar115) * uVar115 |
                      ((short)uStack_a7e >= (short)uVar115) * uStack_a7e;
            uVar119 = ((short)uStack_a7c < (short)uVar118) * uVar118 |
                      ((short)uStack_a7c >= (short)uVar118) * uStack_a7c;
            uVar121 = ((short)uStack_a7a < (short)uVar121) * uVar121 |
                      ((short)uStack_a7a >= (short)uVar121) * uStack_a7a;
            uVar118 = ((short)uVar91 < (short)uVar90) * uVar90 |
                      ((short)uVar91 >= (short)uVar90) * uVar91;
            uVar91 = ((short)uVar100 < (short)uVar99) * uVar99 |
                     ((short)uVar100 >= (short)uVar99) * uVar100;
            uVar115 = ((short)uVar103 < (short)uVar102) * uVar102 |
                      ((short)uVar103 >= (short)uVar102) * uVar103;
            uVar108 = ((short)uVar106 < (short)uVar105) * uVar105 |
                      ((short)uVar106 >= (short)uVar105) * uVar106;
            uVar109 = ((short)uVar109 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                      ((short)uVar109 >= (short)(ushort)vF[0]) * uVar109;
            uVar103 = ((short)uVar116 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                      ((short)uVar116 >= (short)vF[0]._2_2_) * uVar116;
            uVar106 = ((short)uVar119 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                      ((short)uVar119 >= (short)vF[0]._4_2_) * uVar119;
            uVar100 = ((short)uVar121 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                      ((short)uVar121 >= (short)vF[0]._6_2_) * uVar121;
            uVar118 = (-1 < (short)uVar118) * uVar118;
            uVar91 = (-1 < (short)uVar91) * uVar91;
            uVar115 = (-1 < (short)uVar115) * uVar115;
            uVar108 = (-1 < (short)uVar108) * uVar108;
            uVar109 = (-1 < (short)uVar109) * uVar109;
            uVar103 = (-1 < (short)uVar103) * uVar103;
            uVar106 = (-1 < (short)uVar106) * uVar106;
            uVar100 = (-1 < (short)uVar100) * uVar100;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(uVar91 == uStack_a86),-(ushort)(uVar118 == local_a88));
            case2[1]._0_6_ = CONCAT24(-(ushort)(uVar115 == uStack_a84),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(uVar108 == uStack_a82),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(uVar103 == uStack_a7e),-(ushort)(uVar109 == uStack_a80));
            case1[0]._0_6_ = CONCAT24(-(ushort)(uVar106 == uStack_a7c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(uVar100 == uStack_a7a),(undefined6)case1[0]);
            case0[1] = CONCAT26(-(ushort)(uVar108 == uVar105),
                                CONCAT24(-(ushort)(uVar115 == uVar102),
                                         CONCAT22(-(ushort)(uVar91 == uVar99),
                                                  -(ushort)(uVar118 == uVar90))));
            case2[0] = CONCAT26(-(ushort)(uVar100 == vF[0]._6_2_),
                                CONCAT24(-(ushort)(uVar106 == vF[0]._4_2_),
                                         CONCAT22(-(ushort)(uVar103 == vF[0]._2_2_),
                                                  -(ushort)(uVar109 == (ushort)vF[0]))));
            vNH[1] = CONCAT26(-(ushort)(uVar108 == 0),
                              CONCAT24(-(ushort)(uVar115 == 0),
                                       CONCAT22(-(ushort)(uVar91 == 0),-(ushort)(uVar118 == 0))));
            case0[0] = CONCAT26(-(ushort)(uVar100 == 0),
                                CONCAT24(-(ushort)(uVar106 == 0),
                                         CONCAT22(-(ushort)(uVar103 == 0),-(ushort)(uVar109 == 0))))
            ;
            vES[1] = auVar124._0_8_;
            vEM[0] = auVar124._8_8_;
            auVar63._8_8_ = case2[0];
            auVar63._0_8_ = case0[1];
            auVar98 = pblendvb(auVar124,register0x00001240,auVar63);
            local_2a8 = auVar125._2_2_;
            sStack_2a6 = auVar125._4_2_;
            sStack_2a4 = auVar125._6_2_;
            sStack_2a2 = auVar125._8_2_;
            sStack_2a0 = auVar125._10_2_;
            sStack_29e = auVar125._12_2_;
            sStack_29c = auVar125._14_2_;
            auVar80._8_8_ =
                 CONCAT26(-(ushort)(sVar1 == ptr_00[(long)end_ref + 7]),
                          CONCAT24(-(ushort)(sVar2 == sStack_29c),
                                   CONCAT22(-(ushort)(sVar3 == sStack_29e),
                                            -(ushort)(sVar4 == sStack_2a0)))) & 0x1000100010001;
            auVar80._0_8_ =
                 CONCAT26(-(ushort)(sVar5 == sStack_2a2),
                          CONCAT24(-(ushort)(sVar6 == sStack_2a4),
                                   CONCAT22(-(ushort)(sVar7 == sStack_2a6),
                                            -(ushort)(sVar8 == local_2a8)))) & 0x1000100010001;
            auVar125 = paddsw(auVar55,auVar80);
            auVar62._8_8_ = case1[0];
            auVar62._0_8_ = case2[1];
            auVar125 = pblendvb(auVar98,auVar125,auVar62);
            auVar61._8_8_ = case0[0];
            auVar61._0_8_ = vNH[1];
            auVar125 = pblendvb(auVar125,ZEXT816(0),auVar61);
            vEL[1] = auVar97._0_8_;
            vES[0] = auVar97._8_8_;
            auVar60._8_8_ = case2[0];
            auVar60._0_8_ = case0[1];
            auVar124 = pblendvb(auVar97,register0x00001240,auVar60);
            auVar79._8_8_ =
                 CONCAT26(-(ushort)(0 < sVar92),
                          CONCAT24(-(ushort)(0 < sVar101),
                                   CONCAT22(-(ushort)(0 < sVar104),-(ushort)(0 < sVar107)))) &
                 0x1000100010001;
            auVar79._0_8_ =
                 CONCAT26(-(ushort)(0 < sVar110),
                          CONCAT24(-(ushort)(0 < sVar117),
                                   CONCAT22(-(ushort)(0 < sVar120),-(ushort)(0 < sVar122)))) &
                 0x1000100010001;
            auVar98 = paddsw(auVar54,auVar79);
            auVar59._8_8_ = case1[0];
            auVar59._0_8_ = case2[1];
            auVar98 = pblendvb(auVar124,auVar98,auVar59);
            auVar58._8_8_ = case0[0];
            auVar58._0_8_ = vNH[1];
            auVar98 = pblendvb(auVar98,ZEXT816(0),auVar58);
            auVar57._8_8_ = case2[0];
            auVar57._0_8_ = case0[1];
            auVar97 = pblendvb(auVar123,register0x00001200,auVar57);
            auVar78._8_8_ = 0x1000100010001;
            auVar78._0_8_ = 0x1000100010001;
            auVar124 = paddsw(auVar53,auVar78);
            auVar56._8_8_ = case1[0];
            auVar56._0_8_ = case2[1];
            auVar124 = pblendvb(auVar97,auVar124,auVar56);
            auVar55._8_8_ = case0[0];
            auVar55._0_8_ = vNH[1];
            auVar124 = pblendvb(auVar124,ZEXT816(0),auVar55);
            local_2b8 = (short)vs1[1];
            sStack_2b6 = vs1[1]._2_2_;
            sStack_2b4 = vs1[1]._4_2_;
            sStack_2b2 = vs1[1]._6_2_;
            sStack_2b0 = (short)vs1[2];
            sStack_2ae = vs1[2]._2_2_;
            sStack_2ac = vs1[2]._4_2_;
            sStack_2aa = vs1[2]._6_2_;
            sVar92 = -(ushort)(local_2b8 == -1);
            sVar101 = -(ushort)(sStack_2b6 == -1);
            sVar104 = -(ushort)(sStack_2b4 == -1);
            sVar107 = -(ushort)(sStack_2b2 == -1);
            sVar110 = -(ushort)(sStack_2b0 == -1);
            sVar117 = -(ushort)(sStack_2ae == -1);
            sVar120 = -(ushort)(sStack_2ac == -1);
            sVar122 = -(ushort)(sStack_2aa == -1);
            uVar93 = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) &
                     CONCAT26(uVar108,CONCAT24(uVar115,CONCAT22(uVar91,uVar118)));
            uVar111 = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) &
                      CONCAT26(uVar100,CONCAT24(uVar106,CONCAT22(uVar103,uVar109)));
            vWM[1]._0_2_ = (short)uVar93;
            vWM[1]._2_2_ = (short)(uVar93 >> 0x10);
            vWM[1]._4_2_ = (short)(uVar93 >> 0x20);
            vWM[1]._6_2_ = (short)(uVar93 >> 0x30);
            vWH[0]._0_2_ = (short)uVar111;
            vWH[0]._2_2_ = (short)(uVar111 >> 0x10);
            vWH[0]._4_2_ = (short)(uVar111 >> 0x20);
            vWH[0]._6_2_ = (short)(uVar111 >> 0x30);
            vWS[1] = auVar125._0_8_;
            vWM[0] = auVar125._8_8_;
            vWS[1] = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) & vWS[1];
            vWM[0] = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) & vWM[0];
            vWL[1] = auVar98._0_8_;
            vWS[0] = auVar98._8_8_;
            vWL[1] = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) & vWL[1];
            vWS[0] = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) & vWS[0];
            vE[1] = auVar124._0_8_;
            vWL[0] = auVar124._8_8_;
            vE[1] = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) & vE[1];
            vWL[0] = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) & vWL[0];
            auVar125._2_2_ = sVar101;
            auVar125._0_2_ = sVar92;
            auVar125._4_2_ = sVar104;
            auVar125._6_2_ = sVar107;
            auVar125._10_2_ = sVar117;
            auVar125._8_2_ = sVar110;
            auVar125._12_2_ = sVar120;
            auVar125._14_2_ = sVar122;
            auVar54._8_8_ = vE[0];
            auVar54._0_8_ = vE_opn[1];
            auVar53._8_8_ = uVar114;
            auVar53._0_8_ = uVar25;
            register0x00001280 = pblendvb(auVar54,auVar53,auVar125);
            vEM[0] = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) & vEM[0];
            vES[1] = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) & vES[1];
            vES[0] = ~CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) & vES[0];
            vEL[1] = ~CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) & vEL[1];
            uStack_134 = (uint)(CONCAT26(sVar107,CONCAT24(sVar104,CONCAT22(sVar101,sVar92))) >> 0x20
                               );
            uStack_12c = (uint)(CONCAT26(sVar122,CONCAT24(sVar120,CONCAT22(sVar117,sVar110))) >>
                               0x20);
            local_148 = auVar123._0_4_;
            uStack_144 = auVar123._4_4_;
            uStack_140 = auVar123._8_4_;
            uStack_13c = auVar123._12_4_;
            vF[1] = CONCAT44((uStack_134 ^ 0xffffffff) & uStack_144,
                             (CONCAT22(sVar101,sVar92) ^ 0xffffffff) & local_148);
            vEL[0]._0_4_ = (CONCAT22(sVar117,sVar110) ^ 0xffffffff) & uStack_140;
            vEL[0]._4_4_ = (uStack_12c ^ 0xffffffff) & uStack_13c;
            local_b18 = (short)vWS[1];
            local_b38 = (short)vWL[1];
            local_b58 = (short)vE[1];
            if (7 < end_ref) {
              local_58 = (short)vSaturationCheckMax[1];
              sStack_56 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_54 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_52 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_50 = (short)vSaturationCheckMin[0];
              sStack_4e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_4c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_4a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(vWM[1]._6_2_ < sStack_52) * vWM[1]._6_2_ |
                            (ushort)(vWM[1]._6_2_ >= sStack_52) * sStack_52,
                            CONCAT24((ushort)(vWM[1]._4_2_ < sStack_54) * vWM[1]._4_2_ |
                                     (ushort)(vWM[1]._4_2_ >= sStack_54) * sStack_54,
                                     CONCAT22((ushort)(vWM[1]._2_2_ < sStack_56) * vWM[1]._2_2_ |
                                              (ushort)(vWM[1]._2_2_ >= sStack_56) * sStack_56,
                                              (ushort)((short)vWM[1] < local_58) * (short)vWM[1] |
                                              (ushort)((short)vWM[1] >= local_58) * local_58)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(vWH[0]._6_2_ < sStack_4a) * vWH[0]._6_2_ |
                            (ushort)(vWH[0]._6_2_ >= sStack_4a) * sStack_4a,
                            CONCAT24((ushort)(vWH[0]._4_2_ < sStack_4c) * vWH[0]._4_2_ |
                                     (ushort)(vWH[0]._4_2_ >= sStack_4c) * sStack_4c,
                                     CONCAT22((ushort)(vWH[0]._2_2_ < sStack_4e) * vWH[0]._2_2_ |
                                              (ushort)(vWH[0]._2_2_ >= sStack_4e) * sStack_4e,
                                              (ushort)((short)vWH[0] < sStack_50) * (short)vWH[0] |
                                              (ushort)((short)vWH[0] >= sStack_50) * sStack_50)));
              local_ae8 = (short)vNegInf[1];
              sStack_ae6 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_ae4 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_ae2 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_ae0 = (short)vSaturationCheckMax[0];
              sStack_ade = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_adc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_ada = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              uVar91 = (ushort)(local_ae8 < (short)vWM[1]) * (short)vWM[1] |
                       (ushort)(local_ae8 >= (short)vWM[1]) * local_ae8;
              uVar100 = (ushort)(sStack_ae6 < vWM[1]._2_2_) * vWM[1]._2_2_ |
                        (ushort)(sStack_ae6 >= vWM[1]._2_2_) * sStack_ae6;
              uVar103 = (ushort)(sStack_ae4 < vWM[1]._4_2_) * vWM[1]._4_2_ |
                        (ushort)(sStack_ae4 >= vWM[1]._4_2_) * sStack_ae4;
              uVar106 = (ushort)(sStack_ae2 < vWM[1]._6_2_) * vWM[1]._6_2_ |
                        (ushort)(sStack_ae2 >= vWM[1]._6_2_) * sStack_ae2;
              uVar108 = (ushort)(sStack_ae0 < (short)vWH[0]) * (short)vWH[0] |
                        (ushort)(sStack_ae0 >= (short)vWH[0]) * sStack_ae0;
              uVar115 = (ushort)(sStack_ade < vWH[0]._2_2_) * vWH[0]._2_2_ |
                        (ushort)(sStack_ade >= vWH[0]._2_2_) * sStack_ade;
              uVar118 = (ushort)(sStack_adc < vWH[0]._4_2_) * vWH[0]._4_2_ |
                        (ushort)(sStack_adc >= vWH[0]._4_2_) * sStack_adc;
              uVar109 = (ushort)(sStack_ada < vWH[0]._6_2_) * vWH[0]._6_2_ |
                        (ushort)(sStack_ada >= vWH[0]._6_2_) * sStack_ada;
              sStack_b16 = (short)((ulong)vWS[1] >> 0x10);
              sStack_b14 = (short)((ulong)vWS[1] >> 0x20);
              sStack_b12 = (short)((ulong)vWS[1] >> 0x30);
              sStack_b10 = (short)vWM[0];
              sStack_b0e = (short)((ulong)vWM[0] >> 0x10);
              sStack_b0c = (short)((ulong)vWM[0] >> 0x20);
              sStack_b0a = (short)((ulong)vWM[0] >> 0x30);
              uVar91 = (ushort)((short)uVar91 < local_b18) * local_b18 |
                       ((short)uVar91 >= local_b18) * uVar91;
              uVar100 = (ushort)((short)uVar100 < sStack_b16) * sStack_b16 |
                        ((short)uVar100 >= sStack_b16) * uVar100;
              uVar103 = (ushort)((short)uVar103 < sStack_b14) * sStack_b14 |
                        ((short)uVar103 >= sStack_b14) * uVar103;
              uVar106 = (ushort)((short)uVar106 < sStack_b12) * sStack_b12 |
                        ((short)uVar106 >= sStack_b12) * uVar106;
              uVar108 = (ushort)((short)uVar108 < sStack_b10) * sStack_b10 |
                        ((short)uVar108 >= sStack_b10) * uVar108;
              uVar115 = (ushort)((short)uVar115 < sStack_b0e) * sStack_b0e |
                        ((short)uVar115 >= sStack_b0e) * uVar115;
              uVar118 = (ushort)((short)uVar118 < sStack_b0c) * sStack_b0c |
                        ((short)uVar118 >= sStack_b0c) * uVar118;
              uVar109 = (ushort)((short)uVar109 < sStack_b0a) * sStack_b0a |
                        ((short)uVar109 >= sStack_b0a) * uVar109;
              sStack_b36 = (short)((ulong)vWL[1] >> 0x10);
              sStack_b34 = (short)((ulong)vWL[1] >> 0x20);
              sStack_b32 = (short)((ulong)vWL[1] >> 0x30);
              sStack_b30 = (short)vWS[0];
              sStack_b2e = (short)((ulong)vWS[0] >> 0x10);
              sStack_b2c = (short)((ulong)vWS[0] >> 0x20);
              sStack_b2a = (short)((ulong)vWS[0] >> 0x30);
              uVar91 = (ushort)((short)uVar91 < local_b38) * local_b38 |
                       ((short)uVar91 >= local_b38) * uVar91;
              uVar100 = (ushort)((short)uVar100 < sStack_b36) * sStack_b36 |
                        ((short)uVar100 >= sStack_b36) * uVar100;
              uVar103 = (ushort)((short)uVar103 < sStack_b34) * sStack_b34 |
                        ((short)uVar103 >= sStack_b34) * uVar103;
              uVar106 = (ushort)((short)uVar106 < sStack_b32) * sStack_b32 |
                        ((short)uVar106 >= sStack_b32) * uVar106;
              uVar108 = (ushort)((short)uVar108 < sStack_b30) * sStack_b30 |
                        ((short)uVar108 >= sStack_b30) * uVar108;
              uVar115 = (ushort)((short)uVar115 < sStack_b2e) * sStack_b2e |
                        ((short)uVar115 >= sStack_b2e) * uVar115;
              uVar118 = (ushort)((short)uVar118 < sStack_b2c) * sStack_b2c |
                        ((short)uVar118 >= sStack_b2c) * uVar118;
              uVar109 = (ushort)((short)uVar109 < sStack_b2a) * sStack_b2a |
                        ((short)uVar109 >= sStack_b2a) * uVar109;
              sStack_b56 = (short)((ulong)vE[1] >> 0x10);
              sStack_b54 = (short)((ulong)vE[1] >> 0x20);
              sStack_b52 = (short)((ulong)vE[1] >> 0x30);
              sStack_b50 = (short)vWL[0];
              sStack_b4e = (short)((ulong)vWL[0] >> 0x10);
              sStack_b4c = (short)((ulong)vWL[0] >> 0x20);
              sStack_b4a = (short)((ulong)vWL[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)((short)uVar106 < sStack_b52) * sStack_b52 |
                                    ((short)uVar106 >= sStack_b52) * uVar106,
                                    CONCAT24((ushort)((short)uVar103 < sStack_b54) * sStack_b54 |
                                             ((short)uVar103 >= sStack_b54) * uVar103,
                                             CONCAT22((ushort)((short)uVar100 < sStack_b56) *
                                                      sStack_b56 |
                                                      ((short)uVar100 >= sStack_b56) * uVar100,
                                                      (ushort)((short)uVar91 < local_b58) *
                                                      local_b58 |
                                                      ((short)uVar91 >= local_b58) * uVar91)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)((short)uVar109 < sStack_b4a) * sStack_b4a |
                            ((short)uVar109 >= sStack_b4a) * uVar109,
                            CONCAT24((ushort)((short)uVar118 < sStack_b4c) * sStack_b4c |
                                     ((short)uVar118 >= sStack_b4c) * uVar118,
                                     CONCAT22((ushort)((short)uVar115 < sStack_b4e) * sStack_b4e |
                                              ((short)uVar115 >= sStack_b4e) * uVar115,
                                              (ushort)((short)uVar108 < sStack_b50) * sStack_b50 |
                                              ((short)uVar108 >= sStack_b50) * uVar108)));
            }
            ptr_01[(long)(end_ref + -7) + 7] = (short)vWM[1];
            ptr_02[(long)(end_ref + -7) + 7] = local_b18;
            ptr_03[(long)(end_ref + -7) + 7] = local_b38;
            ptr_04[(long)(end_ref + -7) + 7] = local_b58;
            ptr_05[(long)(end_ref + -7) + 7] = uVar90;
            ptr_06[(long)(end_ref + -7) + 7] = (int16_t)vFS[1];
            ptr_07[(long)(end_ref + -7) + 7] = (int16_t)vFL[1];
            ptr_08[(long)(end_ref + -7) + 7] = (int16_t)vJ[1];
            uVar94 = CONCAT26(-(ushort)(-1 < sStack_2b2),
                              CONCAT24(-(ushort)(-1 < sStack_2b4),
                                       CONCAT22(-(ushort)(-1 < sStack_2b6),-(ushort)(-1 < local_2b8)
                                               ))) &
                     CONCAT26(-(ushort)(sStack_2b2 < (short)gap_local),
                              CONCAT24(-(ushort)(sStack_2b4 < (short)gap_local),
                                       CONCAT22(-(ushort)(sStack_2b6 < (short)gap_local),
                                                -(ushort)(local_2b8 < (short)gap_local)))) &
                     CONCAT26(-(ushort)(sStack_a32 < (short)s2Len_PAD),
                              CONCAT24(-(ushort)(sStack_a34 < (short)s2Len_PAD),
                                       CONCAT22(-(ushort)(sStack_a36 < (short)s2Len_PAD),
                                                -(ushort)(local_a38 < (short)s2Len_PAD))));
            uVar112 = CONCAT26(-(ushort)(-1 < sStack_2aa),
                               CONCAT24(-(ushort)(-1 < sStack_2ac),
                                        CONCAT22(-(ushort)(-1 < sStack_2ae),
                                                 -(ushort)(-1 < sStack_2b0)))) &
                      CONCAT26(-(ushort)(sStack_2aa < (short)gap_local),
                               CONCAT24(-(ushort)(sStack_2ac < (short)gap_local),
                                        CONCAT22(-(ushort)(sStack_2ae < (short)gap_local),
                                                 -(ushort)(sStack_2b0 < (short)gap_local)))) &
                      CONCAT26(-(ushort)(sStack_a2a < sStack_a1a),
                               CONCAT24(-(ushort)(sStack_a2c < sStack_a1c),
                                        CONCAT22(-(ushort)(sStack_a2e < sStack_a1e),
                                                 -(ushort)(sStack_a30 < sStack_a20))));
            local_2e8 = (short)vMaxM[1];
            sStack_2e6 = vMaxM[1]._2_2_;
            sStack_2e4 = vMaxM[1]._4_2_;
            sStack_2e2 = vMaxM[1]._6_2_;
            sStack_2e0 = (short)vMaxM[2];
            sStack_2de = vMaxM[2]._2_2_;
            sStack_2dc = vMaxM[2]._4_2_;
            sStack_2da = vMaxM[2]._6_2_;
            uVar95 = CONCAT26(-(ushort)(sStack_2e2 < vWM[1]._6_2_),
                              CONCAT24(-(ushort)(sStack_2e4 < vWM[1]._4_2_),
                                       CONCAT22(-(ushort)(sStack_2e6 < vWM[1]._2_2_),
                                                -(ushort)(local_2e8 < (short)vWM[1])))) & uVar94;
            uVar113 = CONCAT26(-(ushort)(sStack_2da < vWH[0]._6_2_),
                               CONCAT24(-(ushort)(sStack_2dc < vWH[0]._4_2_),
                                        CONCAT22(-(ushort)(sStack_2de < vWH[0]._2_2_),
                                                 -(ushort)(sStack_2e0 < (short)vWH[0])))) & uVar112;
            local_9e8 = (short)vILimit[1];
            sStack_9e6 = vILimit[1]._2_2_;
            sStack_9e4 = vILimit[1]._4_2_;
            sStack_9e2 = vILimit[1]._6_2_;
            sStack_9e0 = (short)vILimit[2];
            sStack_9de = vILimit[2]._2_2_;
            sStack_9dc = vILimit[2]._4_2_;
            sStack_9da = vILimit[2]._6_2_;
            auVar52._8_8_ = uVar111;
            auVar52._0_8_ = uVar93;
            auVar51._8_8_ = uVar113;
            auVar51._0_8_ = uVar95;
            register0x00001240 = pblendvb(stack0xffffffffffffefb8,auVar52,auVar51);
            auVar50._8_8_ = vWM[0];
            auVar50._0_8_ = vWS[1];
            auVar49._8_8_ = uVar113;
            auVar49._0_8_ = uVar95;
            auVar125 = pblendvb(stack0xffffffffffffefa8,auVar50,auVar49);
            auVar48._8_8_ = vWS[0];
            auVar48._0_8_ = vWL[1];
            auVar47._8_8_ = uVar113;
            auVar47._0_8_ = uVar95;
            auVar123 = pblendvb(stack0xffffffffffffef98,auVar48,auVar47);
            auVar46._8_8_ = vWL[0];
            auVar46._0_8_ = vE[1];
            auVar45._8_8_ = uVar113;
            auVar45._0_8_ = uVar95;
            auVar98 = pblendvb(stack0xffffffffffffef88,auVar46,auVar45);
            auVar44._8_8_ = uVar113;
            auVar44._0_8_ = uVar95;
            auVar124 = pblendvb(stack0xffffffffffffef78,stack0xffffffffffffefd8,auVar44);
            auVar43._8_8_ = uVar113;
            auVar43._0_8_ = uVar95;
            auVar97 = pblendvb(stack0xffffffffffffef68,stack0xffffffffffffedc8,auVar43);
            uVar94 = CONCAT26(-(ushort)(sStack_2b2 < sStack_9e2),
                              CONCAT24(-(ushort)(sStack_2b4 < sStack_9e4),
                                       CONCAT22(-(ushort)(sStack_2b6 < sStack_9e6),
                                                -(ushort)(local_2b8 < local_9e8)))) &
                     CONCAT26(-(ushort)(vWM[1]._6_2_ == sStack_2e2),
                              CONCAT24(-(ushort)(vWM[1]._4_2_ == sStack_2e4),
                                       CONCAT22(-(ushort)(vWM[1]._2_2_ == sStack_2e6),
                                                -(ushort)((short)vWM[1] == local_2e8)))) & uVar94;
            uVar112 = CONCAT26(-(ushort)(sStack_2aa < sStack_9da),
                               CONCAT24(-(ushort)(sStack_2ac < sStack_9dc),
                                        CONCAT22(-(ushort)(sStack_2ae < sStack_9de),
                                                 -(ushort)(sStack_2b0 < sStack_9e0)))) &
                      CONCAT26(-(ushort)(vWH[0]._6_2_ == sStack_2da),
                               CONCAT24(-(ushort)(vWH[0]._4_2_ == sStack_2dc),
                                        CONCAT22(-(ushort)(vWH[0]._2_2_ == sStack_2de),
                                                 -(ushort)((short)vWH[0] == sStack_2e0)))) & uVar112
            ;
            auVar42._8_8_ = vWM[0];
            auVar42._0_8_ = vWS[1];
            auVar41._8_8_ = uVar112;
            auVar41._0_8_ = uVar94;
            register0x00001240 = pblendvb(auVar125,auVar42,auVar41);
            auVar40._8_8_ = vWS[0];
            auVar40._0_8_ = vWL[1];
            auVar39._8_8_ = uVar112;
            auVar39._0_8_ = uVar94;
            register0x00001240 = pblendvb(auVar123,auVar40,auVar39);
            auVar38._8_8_ = vWL[0];
            auVar38._0_8_ = vE[1];
            auVar37._8_8_ = uVar112;
            auVar37._0_8_ = uVar94;
            register0x00001240 = pblendvb(auVar98,auVar38,auVar37);
            auVar36._8_8_ = uVar112;
            auVar36._0_8_ = uVar94;
            register0x00001240 = pblendvb(auVar124,stack0xffffffffffffefd8,auVar36);
            auVar35._8_8_ = uVar112;
            auVar35._0_8_ = uVar94;
            register0x00001240 = pblendvb(auVar97,stack0xffffffffffffedc8,auVar35);
            auVar77._8_8_ = 0x1000100010001;
            auVar77._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(stack0xffffffffffffedc8,auVar77);
            unique0x1000666a = auVar76;
            unique0x1000668a = auVar84;
            unique0x100066aa = auVar85;
            unique0x100066ca = auVar86;
          }
          auVar76._8_8_ = 0x8000800080008;
          auVar76._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xffffffffffffefd8,auVar76);
        }
        m = (int16_t *)(vMaxM + 1);
        s = (int16_t *)(vMaxS + 1);
        l = (int16_t *)(vMaxL + 1);
        i_1 = (int16_t *)(vEndI + 1);
        j_1 = (int16_t *)(vEndJ + 1);
        plStack_1398 = vILimit + 1;
        vNegLimit[1]._4_2_ = sVar87;
        vNegLimit[1]._6_2_ = sVar87;
        local_f50 = sVar87;
        local_f4e = sVar87;
        for (local_139c = 0; local_139c < 8; local_139c = local_139c + 1) {
          if (local_f4e < *m) {
            local_f4e = *m;
            local_f50 = *s;
            vNegLimit[1]._6_2_ = *l;
            vNegLimit[1]._4_2_ = *i_1;
            _POS_LIMIT = (int)*j_1;
            _matches = (int)(short)*plStack_1398;
          }
          else if (*m == local_f4e) {
            if ((short)*plStack_1398 < _matches) {
              local_f50 = *s;
              vNegLimit[1]._6_2_ = *l;
              vNegLimit[1]._4_2_ = *i_1;
              _POS_LIMIT = (int)*j_1;
              _matches = (int)(short)*plStack_1398;
            }
            else if (((short)*plStack_1398 == _matches) && (*j_1 < _POS_LIMIT)) {
              local_f50 = *s;
              vNegLimit[1]._6_2_ = *l;
              vNegLimit[1]._4_2_ = *i_1;
              _POS_LIMIT = (int)*j_1;
              _matches = (int)(short)*plStack_1398;
            }
          }
          m = m + 1;
          s = s + 1;
          l = l + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_1398 = (longlong *)((long)plStack_1398 + 2);
        }
        local_9d8 = (short)vSaturationCheckMax[1];
        sStack_9d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_9d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_9d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_9d0 = (short)vSaturationCheckMin[0];
        sStack_9ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_9cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_9ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_9a8 = (short)vNegInf[1];
        sStack_9a6 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_9a4 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_9a2 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_9a0 = (short)vSaturationCheckMax[0];
        sStack_99e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_99c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_99a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar114 = CONCAT26(-(ushort)(sStack_9ca < sVar87),
                           CONCAT24(-(ushort)(sStack_9cc < sVar87),
                                    CONCAT22(-(ushort)(sStack_9ce < sVar87),
                                             -(ushort)(sStack_9d0 < sVar87)))) |
                  CONCAT26(-(ushort)(sVar88 < sStack_99a),
                           CONCAT24(-(ushort)(sVar88 < sStack_99c),
                                    CONCAT22(-(ushort)(sVar88 < sStack_99e),
                                             -(ushort)(sVar88 < sStack_9a0))));
        auVar84._8_8_ = uVar114;
        auVar84._0_8_ =
             CONCAT26(-(ushort)(sStack_9d2 < sVar87),
                      CONCAT24(-(ushort)(sStack_9d4 < sVar87),
                               CONCAT22(-(ushort)(sStack_9d6 < sVar87),-(ushort)(local_9d8 < sVar87)
                                       ))) |
             CONCAT26(-(ushort)(sVar88 < sStack_9a2),
                      CONCAT24(-(ushort)(sVar88 < sStack_9a4),
                               CONCAT22(-(ushort)(sVar88 < sStack_9a6),-(ushort)(sVar88 < local_9a8)
                                       )));
        if ((((((((((((((((auVar84 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar84 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar84 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar84 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar84 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar114 >> 7 & 1) != 0) || (uVar114 >> 0xf & 1) != 0) ||
                (uVar114 >> 0x17 & 1) != 0) || (uVar114 >> 0x1f & 1) != 0) ||
              (uVar114 >> 0x27 & 1) != 0) || (uVar114 >> 0x2f & 1) != 0) ||
            (uVar114 >> 0x37 & 1) != 0) || (long)uVar114 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_f4e = 0;
          local_f50 = 0;
          vNegLimit[1]._6_2_ = 0;
          vNegLimit[1]._4_2_ = 0;
          _POS_LIMIT = 0;
          _matches = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_f4e;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = _matches;
        *(int *)(((parasail_result_t *)_s1_local)->field_4).extra = (int)local_f50;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = (int)vNegLimit[1]._6_2_;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = (int)vNegLimit[1]._4_2_;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            case0 = _mm_cmpeq_epi16(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *m = (int16_t*)&vMaxM;
        int16_t *s = (int16_t*)&vMaxS;
        int16_t *l = (int16_t*)&vMaxL;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}